

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

void P_SpawnPortal(line_t_conflict *line,int sectortag,int plane,int bytealpha,int linked)

{
  double *pdVar1;
  double *pdVar2;
  uint pnum;
  ulong uVar3;
  sector_t_conflict *to;
  ulong uVar4;
  DVector2 local_28;
  
  if (((uint)plane < 3) && (plane != 2 || linked == 0)) {
    uVar4 = 0;
    uVar3 = (ulong)(uint)numlines;
    if (numlines < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 * 0x98 - uVar4 != 0; uVar4 = uVar4 + 0x98) {
      if ((((*(int *)((long)lines->args + (uVar4 - 4)) == 0x39) &&
           (*(int *)((long)lines->args + uVar4) == sectortag)) &&
          (*(int *)((long)lines->args + uVar4 + 4) == linked)) &&
         ((*(int *)((long)lines->args + uVar4 + 8) == plane &&
          (*(int *)((long)lines->args + uVar4 + 0xc) == 1)))) {
        pdVar2 = *(double **)((long)lines->args + (uVar4 - 0x2c));
        to = *(sector_t_conflict **)((long)lines->bbox + uVar4 + 0x20);
        pdVar1 = (double *)((long)lines->args + (uVar4 - 0x1c));
        local_28.X = (*pdVar1 * 0.5 + *pdVar2) - ((line->delta).X * 0.5 + (line->v1->p).X);
        local_28.Y = (pdVar1[1] * 0.5 + pdVar2[1]) - ((line->delta).Y * 0.5 + (line->v1->p).Y);
        pnum = P_GetPortal(3 - (uint)(linked == 0),plane,line->frontsector,to,&local_28);
        CopyPortal(sectortag,plane,pnum,(double)bytealpha / 255.0,SUB81(to,0));
        return;
      }
    }
  }
  return;
}

Assistant:

void P_SpawnPortal(line_t *line, int sectortag, int plane, int bytealpha, int linked)
{
	if (plane < 0 || plane > 2 || (linked && plane == 2)) return;
	for (int i=0;i<numlines;i++)
	{
		// We must look for the reference line with a linear search unless we want to waste the line ID for it
		// which is not a good idea.
		if (lines[i].special == Sector_SetPortal &&
			lines[i].args[0] == sectortag &&
			lines[i].args[1] == linked &&
			lines[i].args[2] == plane &&
			lines[i].args[3] == 1)
		{
			// beware of overflows.
			DVector2 pos1 = line->v1->fPos() + line->Delta() / 2;
			DVector2 pos2 = lines[i].v1->fPos() + lines[i].Delta() / 2;
			unsigned pnum = P_GetPortal(linked ? PORTS_LINKEDPORTAL : PORTS_PORTAL, plane, line->frontsector, lines[i].frontsector, pos2 - pos1);
			CopyPortal(sectortag, plane, pnum, bytealpha / 255., false);
			return;
		}
	}
}